

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.h
# Opt level: O0

void __thiscall btSoftBodyWorldInfo::btSoftBodyWorldInfo(btSoftBodyWorldInfo *this)

{
  undefined4 *in_RDI;
  btScalar local_20;
  btScalar local_1c;
  btScalar local_18;
  btScalar local_14;
  btScalar local_10;
  btScalar local_c [3];
  
  *in_RDI = 0x3f99999a;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0x447a0000;
  local_c[0] = 0.0;
  local_10 = 0.0;
  local_14 = 0.0;
  btVector3::btVector3((btVector3 *)(in_RDI + 4),local_c,&local_10,&local_14);
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 10) = 0;
  local_18 = 0.0;
  local_1c = -10.0;
  local_20 = 0.0;
  btVector3::btVector3((btVector3 *)(in_RDI + 0xc),&local_18,&local_1c,&local_20);
  btSparseSdf<3>::btSparseSdf((btSparseSdf<3> *)0x297da7);
  return;
}

Assistant:

btSoftBodyWorldInfo()
		:air_density((btScalar)1.2),
		water_density(0),
		water_offset(0),
		m_maxDisplacement(1000.f),//avoid soft body from 'exploding' so use some upper threshold of maximum motion that a node can travel per frame
		water_normal(0,0,0),
		m_broadphase(0),
		m_dispatcher(0),
		m_gravity(0,-10,0)
	{
	}